

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

void WebPCopyPixels(WebPPicture *src,WebPPicture *dst)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint32_t *__dest;
  uint32_t *__src;
  
  if (0 < src->height) {
    iVar1 = src->width;
    iVar2 = dst->argb_stride;
    __dest = dst->argb;
    iVar3 = src->argb_stride;
    __src = src->argb;
    iVar4 = src->height + 1;
    do {
      memcpy(__dest,__src,(long)iVar1 << 2);
      __src = __src + iVar3;
      __dest = __dest + iVar2;
      iVar4 = iVar4 + -1;
    } while (1 < iVar4);
  }
  return;
}

Assistant:

void WebPCopyPixels(const WebPPicture* const src, WebPPicture* const dst) {
  assert(src != NULL && dst != NULL);
  assert(src->width == dst->width && src->height == dst->height);
  assert(src->use_argb && dst->use_argb);
  WebPCopyPlane((uint8_t*)src->argb, 4 * src->argb_stride, (uint8_t*)dst->argb,
                4 * dst->argb_stride, 4 * src->width, src->height);
}